

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O1

uint64_t farmhashuo::Hash64WithSeeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong local_58;
  
  if (len < 0x41) {
    uVar1 = farmhashna::Hash64(s,len);
    uVar4 = (uVar1 - seed0 ^ seed1) * -0x622015f714c7d297;
    uVar4 = (uVar4 >> 0x2f ^ seed1 ^ uVar4) * -0x622015f714c7d297;
    uVar1 = (uVar4 >> 0x2f ^ uVar4) * -0x622015f714c7d297;
  }
  else {
    lVar12 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar4 = (ulong)(lVar12 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar12 * -0x651e95c4d06fbfb1;
    local_58 = uVar4 * -0x651e95c4d06fbfb1;
    lVar19 = seed0 + uVar4 * 0x651e95c4d06fbfb1;
    lVar15 = seed0 * -0x651e95c4d06fbfb1;
    lVar2 = (ulong)((uint)lVar19 & 0x82) + 0x9ae16a3b2f90404f;
    plVar3 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    uVar9 = (ulong)((uint)(len - 1) & 0x3f);
    lVar11 = 0;
    uVar4 = 0;
    do {
      lVar16 = *(long *)((long)s + 8);
      lVar6 = *(long *)((long)s + 0x30);
      lVar5 = uVar4 + *(long *)((long)s + 0x38);
      uVar4 = (local_58 + *(long *)((long)s + 0x18)) * lVar2;
      lVar10 = (uVar4 >> 0x20 | uVar4 << 0x20) + lVar5;
      lVar20 = *(long *)s + lVar6 + lVar10 * 9;
      uVar13 = lVar12 + *(long *)((long)s + 0x10);
      uVar4 = seed0 + *(long *)((long)s + 0x20);
      lVar18 = (uVar4 >> 0x21 | uVar4 * 0x80000000) + *(long *)((long)s + 0x10);
      uVar7 = seed1 + lVar16 + *(long *)((long)s + 0x28);
      uVar4 = lVar15 + *(long *)s + lVar16;
      uVar4 = (uVar4 >> 0x1a | uVar4 << 0x26) * 9;
      lVar11 = (lVar11 + lVar6 ^ uVar4) * 9 + *(long *)((long)s + 0x20);
      lVar16 = uVar4 + lVar16;
      local_58 = uVar13 >> 0x1d | uVar13 << 0x23;
      lVar12 = lVar19 + *(long *)((long)s + 0x38) + lVar18;
      lVar19 = lVar16 - lVar12;
      seed0 = lVar18 + lVar19;
      uVar4 = lVar6 + *(long *)((long)s + 0x28) + lVar5 + lVar10 + lVar19;
      seed1 = (uVar7 >> 0x1e | uVar7 << 0x22) + *(long *)((long)s + 0x18) + lVar11;
      lVar11 = lVar11 + seed1;
      lVar15 = lVar16 + uVar4;
      uVar4 = uVar4 >> 0x22 | uVar4 * 0x40000000;
      s = (char *)((long)s + 0x40);
      lVar19 = lVar20;
    } while ((long *)s != plVar3);
    uVar21 = seed1 >> 0x1c | seed1 << 0x24;
    uVar8 = seed0 >> 0x14 | seed0 << 0x2c;
    lVar10 = lVar20 * 9 + lVar12;
    uVar14 = lVar12 + lVar10;
    lVar19 = *(long *)((long)plVar3 + (uVar9 - 0x37));
    uVar13 = (uVar8 - lVar15) + lVar19 + uVar14;
    uVar7 = *(ulong *)((long)plVar3 + (uVar9 - 0xf));
    uVar14 = uVar21 ^ uVar7 ^ uVar14;
    uVar13 = uVar4 * 9 ^ (uVar13 >> 0x25 | uVar13 * 0x8000000) * lVar2;
    lVar12 = *(long *)((long)plVar3 + (uVar9 - 0x17));
    uVar8 = uVar8 + lVar12 + (uVar14 >> 0x2a | uVar14 << 0x16) * lVar2;
    local_58 = local_58 + lVar11 + uVar9;
    uVar14 = local_58 >> 0x21 | local_58 * 0x80000000;
    lVar5 = uVar14 * lVar2;
    lVar18 = uVar21 * lVar2 + *(long *)((long)plVar3 + (uVar9 - 0x3f));
    lVar6 = uVar4 + lVar5 + *(long *)((long)plVar3 + (uVar9 - 0x1f));
    lVar15 = *(long *)((long)plVar3 + (uVar9 - 0x2f));
    lVar16 = *(long *)((long)plVar3 + (uVar9 - 7));
    uVar4 = lVar12 + uVar7 + lVar6;
    lVar12 = *(long *)((long)plVar3 + (uVar9 - 0x27)) + uVar13;
    uVar7 = lVar11 + uVar9 + lVar18 + lVar12;
    uVar21 = lVar19 + lVar15 + lVar18;
    uVar9 = uVar4 + lVar16 ^ uVar8;
    uVar17 = (uVar21 + lVar12 ^ uVar9) * lVar2;
    uVar17 = (uVar17 >> 0x2f ^ uVar9 ^ uVar17) * lVar2;
    uVar9 = lVar15 + uVar8 + lVar16 + lVar6;
    uVar9 = lVar6 + lVar5 + (uVar4 >> 0x2c | uVar4 * 0x100000) + (uVar9 >> 0x15 | uVar9 << 0x2b);
    uVar4 = ((uVar21 >> 0x2c | uVar21 * 0x100000) + lVar18 + uVar8 + (uVar7 >> 0x15 | uVar7 << 0x2b)
            ^ uVar9) * -0x651e95c4d06fbfb1;
    uVar4 = uVar4 >> 0x2f ^ uVar9 ^ uVar4;
    uVar13 = (uVar4 * -0x41befec400000000 | uVar4 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar13;
    uVar4 = (((uVar17 >> 0x2f ^ uVar17) + uVar14) * lVar2 - lVar10 ^ uVar13) * -0x651e95c4d06fbfb1;
    uVar4 = uVar4 >> 0x2f ^ uVar13 ^ uVar4;
    uVar1 = (uVar4 * 0x5f20809e00000000 | uVar4 * -0x651e95c4d06fbfb1 >> 0x1f) * -0x651e95c4d06fbfb1
    ;
  }
  return uVar1;
}

Assistant:

uint64_t Hash64WithSeeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhashna::Hash64WithSeeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = farmhashna::ShiftMix(y * k2) * k2;
  pair<uint64_t, uint64_t> v = make_pair(seed0, seed1);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = Fetch(s);
    uint64_t a1 = Fetch(s + 8);
    uint64_t a2 = Fetch(s + 16);
    uint64_t a3 = Fetch(s + 24);
    uint64_t a4 = Fetch(s + 32);
    uint64_t a5 = Fetch(s + 40);
    uint64_t a6 = Fetch(s + 48);
    uint64_t a7 = Fetch(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.first += a4;
    v.second += a5 + a1;
    w.first += a6;
    w.second += a7;

    x = Rotate(x, 26);
    x *= 9;
    y = Rotate(y, 29);
    z *= mul;
    v.first = Rotate(v.first, 33);
    v.second = Rotate(v.second, 30);
    w.first ^= x;
    w.first *= 9;
    z = Rotate(z, 32);
    z += w.second;
    w.second += z;
    z *= 9;
    std::swap(u, y);

    z += a0 + a6;
    v.first += a2;
    v.second += a3;
    w.first += a4;
    w.second += a5 + a6;
    x += a1;
    y += a7;

    y += v.first;
    v.first += x - y;
    v.second += w.first;
    w.first += v.second;
    w.second += x - y;
    x += w.second;
    w.second = Rotate(w.second, 34);
    std::swap(u, z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.second = Rotate(v.second, 28);
  v.first = Rotate(v.first, 20);
  w.first += ((len - 1) & 63);
  u += y;
  y += u;
  x = Rotate(y - x + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y ^ v.second ^ Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = farmhashna::WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = farmhashna::WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  return H(farmhashna::HashLen16(v.first + x, w.first ^ y, mul) + z - u,
           H(v.second + y, w.second + z, k2, 30) ^ x,
           k2,
           31);
}